

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

int history_def_add(void *p,HistEvent *ev,char *str)

{
  void *pvVar1;
  char *pcVar2;
  int iVar3;
  size_t __n;
  size_t __n_00;
  void *__dest;
  
  pvVar1 = *(void **)((long)p + 0x28);
  if (pvVar1 != p) {
    pcVar2 = *(char **)((long)pvVar1 + 8);
    __n = strlen(pcVar2);
    __n_00 = strlen(str);
    __dest = malloc(__n_00 + __n + 1);
    if (__dest == (void *)0x0) {
      ev->num = 2;
      ev->str = "malloc() failed";
      iVar3 = -1;
    }
    else {
      memcpy(__dest,pcVar2,__n);
      memcpy((void *)((long)__dest + __n),str,__n_00);
      *(undefined1 *)((long)__dest + __n_00 + __n) = 0;
      free(*(void **)((long)pvVar1 + 8));
      *(void **)((long)pvVar1 + 8) = __dest;
      pcVar2 = (char *)(*(undefined8 **)((long)p + 0x28))[1];
      *(undefined8 *)ev = **(undefined8 **)((long)p + 0x28);
      ev->str = pcVar2;
      iVar3 = 0;
    }
    return iVar3;
  }
  iVar3 = history_def_enter(p,ev,str);
  return iVar3;
}

Assistant:

static int
history_def_add(void *p, TYPE(HistEvent) *ev, const Char *str)
{
	history_t *h = (history_t *) p;
	size_t len, elen, slen;
	Char *s;
	HistEventPrivate *evp = (void *)&h->cursor->ev;

	if (h->cursor == &h->list)
		return history_def_enter(p, ev, str);
	elen = Strlen(evp->str);
	slen = Strlen(str);
	len = elen + slen + 1;
	s = h_malloc(len * sizeof(*s));
	if (s == NULL) {
		he_seterrev(ev, _HE_MALLOC_FAILED);
		return -1;
	}
	memcpy(s, evp->str, elen * sizeof(*s));
	memcpy(s + elen, str, slen * sizeof(*s)); 
        s[len - 1] = '\0';
	h_free(evp->str);
	evp->str = s;
	*ev = h->cursor->ev;
	return 0;
}